

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

Var create_module(Context *ctx,Module *module,bool validate)

{
  CreateBufferFn p_Var1;
  bool bVar2;
  Result RVar3;
  uint uVar4;
  WabtAPIError *pWVar5;
  OutputBuffer *pOVar6;
  uchar *puVar7;
  size_t value;
  Var pvVar8;
  Features FVar9;
  size_t size;
  uint8_t *data;
  WriteBinaryOptions local_9b;
  Result result;
  WriteBinaryOptions s_write_binary_options;
  MemoryStream stream;
  undefined1 local_68 [4];
  Result result_1;
  Errors errors;
  bool local_48;
  pointer local_40;
  bool local_38;
  undefined1 local_35 [8];
  ValidateOptions options;
  bool validate_local;
  Module *module_local;
  Context *ctx_local;
  
  if (module == (Module *)0x0) {
    pWVar5 = (WabtAPIError *)__cxa_allocate_exception(8);
    ChakraWabt::WabtAPIError::WabtAPIError(pWVar5,"No module found");
    __cxa_throw(pWVar5,&ChakraWabt::WabtAPIError::typeinfo,0);
  }
  if (validate) {
    FVar9 = GetWabtFeatures(ctx->chakra);
    local_48 = FVar9.bulk_memory_enabled_;
    local_38 = local_48;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = FVar9._0_8_;
    local_40 = errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    wabt::ValidateOptions::ValidateOptions((ValidateOptions *)local_35,(Features *)&local_40);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_68);
    RVar3 = wabt::ValidateModule
                      (module,(vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_68,
                       (ValidateOptions *)local_35);
    CheckResult(RVar3,(Errors *)local_68,ctx->lexer,"Failed to validate module");
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_68);
  }
  wabt::MemoryStream::MemoryStream((MemoryStream *)&result,(Stream *)0x0);
  wabt::WriteBinaryOptions::WriteBinaryOptions(&local_9b);
  RVar3 = wabt::WriteBinaryModule((Stream *)&result,module,&local_9b);
  bVar2 = wabt::Succeeded(RVar3);
  if (!bVar2) {
    pWVar5 = (WabtAPIError *)__cxa_allocate_exception(8);
    ChakraWabt::WabtAPIError::WabtAPIError(pWVar5,"Error while writing module");
    __cxa_throw(pWVar5,&ChakraWabt::WabtAPIError::typeinfo,0);
  }
  pOVar6 = wabt::MemoryStream::output_buffer((MemoryStream *)&result);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pOVar6->data);
  pOVar6 = wabt::MemoryStream::output_buffer((MemoryStream *)&result);
  value = wabt::OutputBuffer::size(pOVar6);
  p_Var1 = ctx->chakra->createBuffer;
  uVar4 = TruncSizeT(value);
  pvVar8 = (*p_Var1)(puVar7,uVar4,ctx->chakra->user_data);
  wabt::MemoryStream::~MemoryStream((MemoryStream *)&result);
  return pvVar8;
}

Assistant:

Js::Var create_module(Context* ctx, const Module* module, bool validate = true)
{
    if (!module)
    {
        throw WabtAPIError("No module found");
    }
    if (validate)
    {
        ValidateOptions options(GetWabtFeatures(*ctx->chakra));
        Errors errors;
        Result result = ValidateModule(module, &errors, options);
        CheckResult(result, &errors, ctx->lexer, "Failed to validate module");
    }
    MemoryStream stream;
    WriteBinaryOptions s_write_binary_options;
    Result result = WriteBinaryModule(&stream, module, s_write_binary_options);
    if (!Succeeded(result))
    {
        throw WabtAPIError("Error while writing module");
    }
    const uint8_t* data = stream.output_buffer().data.data();
    const size_t size = stream.output_buffer().size();
    return ctx->chakra->createBuffer(data, TruncSizeT(size), ctx->chakra->user_data);
}